

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.cpp
# Opt level: O0

void __thiscall llvm::StringMapImpl::StringMapImpl(StringMapImpl *this,uint InitSize,uint itemSize)

{
  uint uVar1;
  uint itemSize_local;
  uint InitSize_local;
  StringMapImpl *this_local;
  
  this->TheTable = (StringMapEntryBase **)0x0;
  this->NumBuckets = 0;
  this->NumItems = 0;
  this->NumTombstones = 0;
  this->ItemSize = itemSize;
  if (InitSize == 0) {
    this->TheTable = (StringMapEntryBase **)0x0;
    this->NumBuckets = 0;
    this->NumItems = 0;
    this->NumTombstones = 0;
  }
  else {
    uVar1 = getMinBucketToReserveForEntries(InitSize);
    init(this,(EVP_PKEY_CTX *)(ulong)uVar1);
  }
  return;
}

Assistant:

StringMapImpl::StringMapImpl(unsigned InitSize, unsigned itemSize) {
  ItemSize = itemSize;

  // If a size is specified, initialize the table with that many buckets.
  if (InitSize) {
    // The table will grow when the number of entries reach 3/4 of the number of
    // buckets. To guarantee that "InitSize" number of entries can be inserted
    // in the table without growing, we allocate just what is needed here.
    init(getMinBucketToReserveForEntries(InitSize));
    return;
  }

  // Otherwise, initialize it with zero buckets to avoid the allocation.
  TheTable = nullptr;
  NumBuckets = 0;
  NumItems = 0;
  NumTombstones = 0;
}